

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_ftssel_s_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  intptr_t iVar2;
  undefined4 local_54;
  uint32_t mm;
  uint32_t nn;
  uint32_t *m;
  uint32_t *n;
  uint32_t *d;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  iVar2 = simd_oprsz(desc);
  for (opr_sz = 0; opr_sz < iVar2 / 4; opr_sz = opr_sz + 1) {
    local_54 = *(uint *)((long)vn + opr_sz * 4);
    uVar1 = *(uint *)((long)vm + opr_sz * 4);
    if ((uVar1 & 1) != 0) {
      local_54 = 0x3f800000;
    }
    *(uint *)((long)vd + opr_sz * 4) = local_54 ^ (uVar1 & 2) << 0x1e;
  }
  return;
}

Assistant:

void HELPER(sve_ftssel_s)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc) / 4;
    uint32_t *d = vd, *n = vn, *m = vm;
    for (i = 0; i < opr_sz; i += 1) {
        uint32_t nn = n[i];
        uint32_t mm = m[i];
        if (mm & 1) {
            nn = float32_one;
        }
        d[i] = nn ^ (mm & 2) << 30;
    }
}